

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::WriteCompileRule
          (cmNinjaTargetGenerator *this,string *lang,string *config,WithScanning withScanning)

{
  cmList *pcVar1;
  string_view srcFile;
  string_view ddiFile;
  string_view ddiFile_00;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> srcOrigFile;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> srcOrigFile_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  string_view sVar2;
  bool bVar3;
  bool bVar4;
  TargetType targetType;
  int iVar5;
  cmGeneratorTarget *pcVar6;
  cmMakefile *pcVar7;
  string *psVar8;
  cmLocalNinjaGenerator *pcVar9;
  cmMakefile *pcVar10;
  string *psVar11;
  pointer pcVar12;
  container_type *pcVar13;
  cmGlobalNinjaGenerator *pcVar14;
  ulong uVar15;
  const_iterator pvVar16;
  reference pvVar17;
  char *pcVar18;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view cmakeCmd_00;
  string_view cmakeCmd_01;
  string_view tdi_00;
  string_view tdi_01;
  string *local_14e0;
  string local_1328;
  string local_1308;
  string local_12e8;
  string local_12c8;
  string local_12a8;
  reference local_1288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i_2;
  iterator __end1;
  iterator __begin1;
  cmList *__range1;
  string local_1260;
  string *local_1240;
  string *extraCommands;
  cmList compileCmds;
  string *compileCmd;
  string cmdVar;
  allocator<char> local_11d1;
  string local_11d0;
  string *local_11b0;
  string *wholeFlag;
  string local_11a0;
  string *local_1180;
  string *flag;
  string defName;
  string propName;
  string_view mode;
  const_iterator __end2;
  const_iterator __begin2;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_4UL> *__range2;
  bool useNormalCompileMode;
  string local_10c0;
  allocator<char> local_1099;
  string local_1098;
  string *local_1078;
  string *rdcFlag;
  string local_1068;
  undefined1 local_1048 [8];
  string cudaCompileMode;
  string local_1020;
  string local_1000;
  undefined1 local_fe0 [8];
  string modmapFlags;
  string local_fb8;
  undefined1 local_f98 [8];
  string depfileFlags;
  string flagsName;
  string local_f28;
  string *local_f08;
  string *depType;
  string local_ef8;
  char local_ed2 [2];
  string local_ed0;
  Status local_eb0;
  undefined1 local_ea8 [8];
  string cmcldepsPath;
  string local_e80;
  undefined1 local_e60 [8];
  string cl;
  string local_e38;
  cmValue local_e18;
  cmValue d;
  string local_df0 [8];
  string cldeps;
  string local_dc8;
  string local_da8;
  char local_d83 [3];
  string local_d80;
  string local_d60;
  undefined1 local_d40 [8];
  cmNinjaRule rule;
  char local_bf1;
  string local_bf0;
  string local_bd0;
  string local_bb0;
  undefined1 local_b90 [8];
  string ccmd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ddCmds;
  undefined1 local_b38 [8];
  string ddModmapArg;
  undefined1 local_af8 [8];
  cmNinjaRule rule_1;
  string local_9b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_990;
  allocator<char> local_971;
  string local_970;
  allocator<char> local_949;
  string local_948;
  undefined1 local_928 [8];
  cmNinjaRule scanRule_1;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_7f8;
  undefined8 local_7e8;
  basic_string_view<char,_std::char_traits<char>_> local_7e0;
  basic_string_view<char,_std::char_traits<char>_> local_7d0;
  string_view local_7c0;
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [16];
  string local_790;
  undefined1 local_770 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  scanCommands_1;
  string *scanRuleName_1;
  string local_710;
  string local_6f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6d0;
  undefined1 local_6b8 [8];
  cmNinjaRule scanRule;
  undefined8 uStack_588;
  undefined8 local_580;
  basic_string_view<char,_std::char_traits<char>_> local_578;
  basic_string_view<char,_std::char_traits<char>_> local_568;
  string_view local_558;
  undefined1 local_548 [16];
  undefined1 local_538 [16];
  string local_528;
  string local_508;
  reference local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i_1;
  iterator __end3_1;
  iterator __begin3_1;
  cmList *__range3_1;
  string *local_4a8;
  string *ppCommmand;
  string local_480;
  reference local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  iterator __end3;
  iterator __begin3;
  cmList *__range3;
  string *local_420;
  string *scanCommand;
  undefined1 local_3f8 [8];
  string ppFileName;
  string scanRuleName;
  cmList scanCommands;
  string *scanDepType;
  undefined1 local_368 [8];
  string cmakeCmd;
  string local_340;
  string_view local_320;
  allocator<char> local_309;
  string local_308;
  undefined1 local_2e8 [8];
  string val;
  string launcher;
  undefined1 local_278 [8];
  string tdi;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string modmapFormat;
  string modmapFormatVar;
  string responseFlagVar;
  undefined1 local_1e8 [7];
  bool lang_supports_response;
  string responseFlag;
  allocator<char> local_1b1;
  undefined1 local_1b0 [8];
  string flags;
  bool compilationPreprocesses;
  cmMakefile *mf;
  RuleVariables vars;
  WithScanning withScanning_local;
  string *config_local;
  string *lang_local;
  cmNinjaTargetGenerator *this_local;
  
  vars.Launcher._4_4_ = withScanning;
  cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)&mf);
  pcVar6 = GetGeneratorTarget(this);
  cmGeneratorTarget::GetName_abi_cxx11_(pcVar6);
  mf = (cmMakefile *)std::__cxx11::string::c_str();
  pcVar6 = GetGeneratorTarget(this);
  targetType = cmGeneratorTarget::GetType(pcVar6);
  cmState::GetTargetTypeName_abi_cxx11_(targetType);
  vars.CMTargetName = (char *)std::__cxx11::string::c_str();
  vars.TargetVersionMinor = (char *)std::__cxx11::string::c_str();
  vars.LinkLibraries = "$in";
  vars.Output = "$out";
  vars.LanguageCompileFlags = "$DEFINES";
  vars.Defines = "$INCLUDES";
  vars.CMTargetType = "$TARGET_PDB";
  vars.TargetPDB = "$TARGET_COMPILE_PDB";
  vars.Object = "$OBJECT_DIR";
  vars.ObjectDir = "$OBJECT_FILE_DIR";
  vars.ISPCHeader = "$CUDA_COMPILE_MODE";
  vars.SwiftSources = "$ISPC_HEADER_FILE";
  pcVar7 = GetMakefile(this);
  bVar3 = NeedExplicitPreprocessing(this,lang);
  flags.field_2._M_local_buf[0xf] = !bVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1b0,"$FLAGS",&local_1b1);
  std::allocator<char>::~allocator(&local_1b1);
  std::__cxx11::string::string((string *)local_1e8);
  bVar3 = std::operator!=(lang,"RC");
  if ((bVar3) && (bVar3 = ForceResponseFile(this), bVar3)) {
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[20]>
              ((string *)((long)&modmapFormatVar.field_2 + 8),(char (*) [7])0xfecd37,lang,
               (char (*) [20])"_RESPONSE_FILE_FLAG");
    psVar8 = cmMakefile::GetSafeDefinition
                       ((this->super_cmCommonTargetGenerator).Makefile,
                        (string *)((long)&modmapFormatVar.field_2 + 8));
    std::__cxx11::string::operator=((string *)local_1e8,(string *)psVar8);
    uVar15 = std::__cxx11::string::empty();
    if (((uVar15 & 1) != 0) && (bVar3 = std::operator!=(lang,"CUDA"), bVar3)) {
      std::__cxx11::string::operator=((string *)local_1e8,"@");
    }
    std::__cxx11::string::~string((string *)(modmapFormatVar.field_2._M_local_buf + 8));
  }
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[19]>
            ((string *)((long)&modmapFormat.field_2 + 8),(char (*) [7])0xfecd37,lang,
             (char (*) [19])"_MODULE_MAP_FORMAT");
  psVar8 = cmMakefile::GetSafeDefinition
                     ((this->super_cmCommonTargetGenerator).Makefile,
                      (string *)((long)&modmapFormat.field_2 + 8));
  std::__cxx11::string::string((string *)&rulePlaceholderExpander,(string *)psVar8);
  pcVar9 = GetLocalGenerator(this);
  (*(pcVar9->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
    _vptr_cmOutputConverter[6])((undefined1 *)((long)&tdi.field_2 + 8));
  pcVar9 = GetLocalGenerator(this);
  GetTargetDependInfoPath((string *)((long)&launcher.field_2 + 8),this,lang,config);
  psVar8 = ConvertToNinjaPath(this,(string *)((long)&launcher.field_2 + 8));
  sVar2 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar8);
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            ((string *)local_278,(cmOutputConverter *)pcVar9,sVar2,SHELL,false);
  std::__cxx11::string::~string((string *)(launcher.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(val.field_2._M_local_buf + 8));
  pcVar9 = GetLocalGenerator(this);
  pcVar6 = GetGeneratorTarget(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,"RULE_LAUNCH_COMPILE",&local_309);
  cmLocalGenerator::GetRuleLauncher
            ((string *)local_2e8,(cmLocalGenerator *)pcVar9,pcVar6,&local_308,config);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator(&local_309);
  local_320 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_2e8);
  bVar3 = cmNonempty(local_320);
  if (bVar3) {
    cmakeCmd.field_2._M_local_buf[0xf] = ' ';
    cmStrCat<std::__cxx11::string&,char>
              (&local_340,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8,
               cmakeCmd.field_2._M_local_buf + 0xf);
    std::__cxx11::string::operator=((string *)(val.field_2._M_local_buf + 8),(string *)&local_340);
    std::__cxx11::string::~string((string *)&local_340);
  }
  pcVar9 = GetLocalGenerator(this);
  psVar8 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  sVar2 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar8);
  pcVar18 = (char *)0x0;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            ((string *)local_368,(cmOutputConverter *)pcVar9,sVar2,SHELL,false);
  if (vars.Launcher._4_4_ == Yes) {
    pcVar10 = GetMakefile(this);
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[24]>
              ((string *)
               &scanCommands.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(char (*) [7])0xfecd37,lang,
               (char (*) [24])"_SCANDEP_DEPFILE_FORMAT");
    psVar8 = cmMakefile::GetSafeDefinition
                       (pcVar10,(string *)
                                &scanCommands.Values.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &scanCommands.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmList::cmList((cmList *)((long)&scanRuleName.field_2 + 8));
    std::__cxx11::string::string((string *)(ppFileName.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_3f8);
    if ((flags.field_2._M_local_buf[0xf] & 1U) == 0) {
      LanguagePreprocessAndScanRule((string *)&ppCommmand,this,lang,config);
      std::__cxx11::string::operator=
                ((string *)(ppFileName.field_2._M_local_buf + 8),(string *)&ppCommmand);
      std::__cxx11::string::~string((string *)&ppCommmand);
      std::__cxx11::string::operator=((string *)local_3f8,"$out");
      cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[19]>
                ((string *)&__range3_1,(char (*) [7])0xfecd37,lang,
                 (char (*) [19])"_PREPROCESS_SOURCE");
      psVar11 = cmMakefile::GetRequiredDefinition(pcVar7,(string *)&__range3_1);
      std::__cxx11::string::~string((string *)&__range3_1);
      local_4a8 = psVar11;
      cmList::assign((cmList *)((long)&scanRuleName.field_2 + 8),psVar11,Yes,No);
      pcVar1 = (cmList *)((long)&scanRuleName.field_2 + 8);
      __end3_1 = cmList::begin_abi_cxx11_(pcVar1);
      i_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            cmList::end_abi_cxx11_(pcVar1);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end3_1,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&i_1);
        if (!bVar3) break;
        local_4e8 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end3_1);
        cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
                  (&local_508,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&val.field_2 + 8),local_4e8);
        std::__cxx11::string::operator=((string *)local_4e8,(string *)&local_508);
        std::__cxx11::string::~string((string *)&local_508);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3_1);
      }
      local_538 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_368);
      local_548 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_278);
      local_558 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)lang);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_568,"$out");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_578,"$DYNDEP_INTERMEDIATE_FILE");
      std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
      optional<const_char_(&)[4],_true>
                ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                 &scanRule.Generator,(char (*) [4])0xfb770f);
      sVar2._M_str = local_568._M_str;
      sVar2._M_len = local_568._M_len;
      ddiFile._M_str = local_578._M_str;
      ddiFile._M_len = local_578._M_len;
      srcOrigFile.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._M_value._M_str = (char *)uStack_588;
      srcOrigFile.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._M_value._M_len = scanRule._288_8_;
      srcOrigFile.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._16_8_ =
           local_580;
      cmakeCmd_00._M_str = (char *)local_548._0_8_;
      cmakeCmd_00._M_len = local_538._8_8_;
      tdi_00._M_str = pcVar18;
      tdi_00._M_len = local_548._8_8_;
      (anonymous_namespace)::GetScanCommand_abi_cxx11_
                (&local_528,(_anonymous_namespace_ *)local_538._0_8_,cmakeCmd_00,tdi_00,local_558,
                 sVar2,ddiFile,srcOrigFile);
      cmList::emplace_back<std::__cxx11::string>
                ((cmList *)((long)&scanRuleName.field_2 + 8),&local_528);
      std::__cxx11::string::~string((string *)&local_528);
    }
    else {
      LanguageScanRule((string *)&scanCommand,this,lang,config);
      std::__cxx11::string::operator=
                ((string *)(ppFileName.field_2._M_local_buf + 8),(string *)&scanCommand);
      std::__cxx11::string::~string((string *)&scanCommand);
      std::__cxx11::string::operator=((string *)local_3f8,"$PREPROCESSED_OUTPUT_FILE");
      cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16]>
                ((string *)&__range3,(char (*) [7])0xfecd37,lang,(char (*) [16])0xfdaa09);
      psVar11 = cmMakefile::GetRequiredDefinition(pcVar7,(string *)&__range3);
      std::__cxx11::string::~string((string *)&__range3);
      local_420 = psVar11;
      cmList::assign((cmList *)((long)&scanRuleName.field_2 + 8),psVar11,Yes,No);
      pcVar1 = (cmList *)((long)&scanRuleName.field_2 + 8);
      __end3 = cmList::begin_abi_cxx11_(pcVar1);
      i = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          cmList::end_abi_cxx11_(pcVar1);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&i);
        if (!bVar3) break;
        local_460 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end3);
        cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
                  (&local_480,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&val.field_2 + 8),local_460);
        std::__cxx11::string::operator=((string *)local_460,(string *)&local_480);
        std::__cxx11::string::~string((string *)&local_480);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
    }
    pcVar12 = std::
              unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
              ::get((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                     *)((long)&tdi.field_2 + 8));
    pcVar9 = GetLocalGenerator(this);
    pcVar13 = cmList::operator_cast_to_vector__((cmList *)((long)&scanRuleName.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_6d0,pcVar13);
    psVar11 = (string *)local_1e8;
    anon_unknown.dwarf_80fa62::GetScanRule
              ((cmNinjaRule *)local_6b8,(string *)((long)&ppFileName.field_2 + 8),
               (string *)local_3f8,psVar8,(RuleVariables *)&mf,psVar11,(string *)local_1b0,pcVar12,
               pcVar9,&local_6d0,config);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_6d0);
    cmStrCat<char_const(&)[21],std::__cxx11::string_const&,char_const(&)[15]>
              (&local_6f0,(char (*) [21])"Rule for generating ",lang,(char (*) [15])0xfe944a);
    std::__cxx11::string::operator=
              ((string *)(scanRule.Description.field_2._M_local_buf + 8),(string *)&local_6f0);
    std::__cxx11::string::~string((string *)&local_6f0);
    if ((flags.field_2._M_local_buf[0xf] & 1U) == 0) {
      cmStrCat<char_const(&)[10],std::__cxx11::string_const&,char_const(&)[19]>
                ((string *)&scanRuleName_1,(char (*) [10])"Building ",lang,
                 (char (*) [19])" preprocessed $out");
      std::__cxx11::string::operator=
                ((string *)(scanRule.Command.field_2._M_local_buf + 8),(string *)&scanRuleName_1);
      std::__cxx11::string::~string((string *)&scanRuleName_1);
    }
    else {
      cmStrCat<char_const(&)[18],std::__cxx11::string_const&,char_const(&)[14]>
                (&local_710,(char (*) [18])"Scanning $in for ",lang,(char (*) [14])0xfb1a11);
      std::__cxx11::string::operator=
                ((string *)(scanRule.Command.field_2._M_local_buf + 8),(string *)&local_710);
      std::__cxx11::string::~string((string *)&local_710);
    }
    pcVar14 = GetGlobalGenerator(this);
    cmGlobalNinjaGenerator::AddRule(pcVar14,(cmNinjaRule *)local_6b8);
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_6b8);
    std::__cxx11::string::~string((string *)local_3f8);
    std::__cxx11::string::~string((string *)(ppFileName.field_2._M_local_buf + 8));
    cmList::~cmList((cmList *)((long)&scanRuleName.field_2 + 8));
    if ((flags.field_2._M_local_buf[0xf] & 1U) == 0) {
      bVar3 = CompileWithDefines(this,lang);
      if (!bVar3) {
        vars.LanguageCompileFlags = "";
      }
      LanguageScanRule((string *)
                       &scanCommands_1.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,this,lang,config);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_770);
      local_7a0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_368);
      local_7b0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_278);
      local_7c0 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)lang);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_7d0,"$in");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_7e0,"$out");
      std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::optional
                ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_7f8);
      srcFile._M_str = local_7d0._M_str;
      srcFile._M_len = local_7d0._M_len;
      ddiFile_00._M_str = local_7e0._M_str;
      ddiFile_00._M_len = local_7e0._M_len;
      srcOrigFile_00.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._M_value._M_str = local_7f8._M_value._M_str;
      srcOrigFile_00.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._M_value._M_len = local_7f8._M_value._M_len;
      srcOrigFile_00.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._16_8_ =
           local_7e8;
      cmakeCmd_01._M_str = (char *)local_7b0._0_8_;
      cmakeCmd_01._M_len = local_7a0._8_8_;
      tdi_01._M_str = (char *)psVar11;
      tdi_01._M_len = local_7b0._8_8_;
      (anonymous_namespace)::GetScanCommand_abi_cxx11_
                (&local_790,(_anonymous_namespace_ *)local_7a0._0_8_,cmakeCmd_01,tdi_01,local_7c0,
                 srcFile,ddiFile_00,srcOrigFile_00);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_770,
                 &local_790);
      std::__cxx11::string::~string((string *)&local_790);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_948,"",&local_949);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_970,"",&local_971);
      pcVar12 = std::
                unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                ::get((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                       *)((long)&tdi.field_2 + 8));
      pcVar9 = GetLocalGenerator(this);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_990,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_770);
      anon_unknown.dwarf_80fa62::GetScanRule
                ((cmNinjaRule *)local_928,
                 (string *)
                 &scanCommands_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_948,psVar8,
                 (RuleVariables *)&mf,&local_970,(string *)local_1b0,pcVar12,pcVar9,&local_990,
                 config);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_990);
      std::__cxx11::string::~string((string *)&local_970);
      std::allocator<char>::~allocator(&local_971);
      std::__cxx11::string::~string((string *)&local_948);
      std::allocator<char>::~allocator(&local_949);
      cmStrCat<char_const(&)[21],std::__cxx11::string_const&,char_const(&)[41]>
                (&local_9b0,(char (*) [21])"Rule for generating ",lang,
                 (char (*) [41])" dependencies on non-preprocessed files.");
      std::__cxx11::string::operator=
                ((string *)(scanRule_1.Description.field_2._M_local_buf + 8),(string *)&local_9b0);
      std::__cxx11::string::~string((string *)&local_9b0);
      cmStrCat<char_const(&)[12],std::__cxx11::string_const&,char_const(&)[22]>
                ((string *)&rule_1.Generator,(char (*) [12])"Generating ",lang,
                 (char (*) [22])" dependencies for $in");
      std::__cxx11::string::operator=
                ((string *)(scanRule_1.Command.field_2._M_local_buf + 8),(string *)&rule_1.Generator
                );
      std::__cxx11::string::~string((string *)&rule_1.Generator);
      pcVar14 = GetGlobalGenerator(this);
      cmGlobalNinjaGenerator::AddRule(pcVar14,(cmNinjaRule *)local_928);
      cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_928);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_770);
      std::__cxx11::string::~string
                ((string *)
                 &scanCommands_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    LanguageDyndepRule((string *)((long)&ddModmapArg.field_2 + 8),this,lang,config);
    cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_af8,(string *)((long)&ddModmapArg.field_2 + 8));
    std::__cxx11::string::~string((string *)(ddModmapArg.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=((string *)(rule_1.DepType.field_2._M_local_buf + 8),"$out.rsp");
    std::__cxx11::string::operator=((string *)(rule_1.RspFile.field_2._M_local_buf + 8),"$in");
    std::__cxx11::string::operator=((string *)(rule_1.RspContent.field_2._M_local_buf + 8),"1");
    std::__cxx11::string::string((string *)local_b38);
    uVar15 = std::__cxx11::string::empty();
    if ((uVar15 & 1) == 0) {
      cmStrCat<char_const(&)[14],std::__cxx11::string_const&>
                ((string *)
                 &ddCmds.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(char (*) [14])" --modmapfmt=",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &rulePlaceholderExpander);
      std::__cxx11::string::operator+=
                ((string *)local_b38,
                 (string *)
                 &ddCmds.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &ddCmds.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&ccmd.field_2 + 8));
    cmStrCat<std::__cxx11::string_const&,char_const(&)[30],std::__cxx11::string_const&,char_const(&)[9],std::__cxx11::string_const&,std::__cxx11::string&,char_const(&)[13],std::__cxx11::string&>
              ((string *)local_b90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368,
               (char (*) [30])" -E cmake_ninja_dyndep --tdi=",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
               (char (*) [9])0xfb654c,lang,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b38,
               (char (*) [13])" --dd=$out @",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&rule_1.DepType.field_2 + 8));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               (ccmd.field_2._M_local_buf + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b90);
    std::__cxx11::string::~string((string *)local_b90);
    pcVar9 = GetLocalGenerator(this);
    std::__cxx11::string::string((string *)&local_bd0);
    cmLocalNinjaGenerator::BuildCommandLine
              (&local_bb0,pcVar9,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&ccmd.field_2 + 8),config,config,&local_bd0,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=
              ((string *)(rule_1.Name.field_2._M_local_buf + 8),(string *)&local_bb0);
    std::__cxx11::string::~string((string *)&local_bb0);
    std::__cxx11::string::~string((string *)&local_bd0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&ccmd.field_2 + 8));
    local_bf1 = '.';
    cmStrCat<char_const(&)[41],std::__cxx11::string_const&,char>
              (&local_bf0,(char (*) [41])"Rule to generate ninja dyndep files for ",lang,&local_bf1)
    ;
    std::__cxx11::string::operator=
              ((string *)(rule_1.Description.field_2._M_local_buf + 8),(string *)&local_bf0);
    std::__cxx11::string::~string((string *)&local_bf0);
    cmStrCat<char_const(&)[12],std::__cxx11::string_const&,char_const(&)[18]>
              ((string *)&rule.Generator,(char (*) [12])"Generating ",lang,
               (char (*) [18])" dyndep file $out");
    std::__cxx11::string::operator=
              ((string *)(rule_1.Command.field_2._M_local_buf + 8),(string *)&rule.Generator);
    std::__cxx11::string::~string((string *)&rule.Generator);
    pcVar14 = GetGlobalGenerator(this);
    cmGlobalNinjaGenerator::AddRule(pcVar14,(cmNinjaRule *)local_af8);
    std::__cxx11::string::~string((string *)local_b38);
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_af8);
  }
  LanguageCompilerRule(&local_d60,this,lang,config,vars.Launcher._4_4_);
  cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_d40,&local_d60);
  std::__cxx11::string::~string((string *)&local_d60);
  uVar15 = std::__cxx11::string::empty();
  if ((uVar15 & 1) == 0) {
    std::__cxx11::string::operator=((string *)(rule.DepType.field_2._M_local_buf + 8),"$RSP_FILE");
    local_d83[2] = 0x20;
    local_d83[1] = 0x20;
    local_d83[0] = ' ';
    cmStrCat<char,char_const*&,char,char_const*&,char,std::__cxx11::string&>
              (&local_d80,local_d83 + 2,&vars.LanguageCompileFlags,local_d83 + 1,&vars.Defines,
               local_d83,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
    std::__cxx11::string::operator=
              ((string *)(rule.RspFile.field_2._M_local_buf + 8),(string *)&local_d80);
    std::__cxx11::string::~string((string *)&local_d80);
    cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
              (&local_da8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&rule.DepType.field_2 + 8));
    std::__cxx11::string::operator=((string *)local_1b0,(string *)&local_da8);
    std::__cxx11::string::~string((string *)&local_da8);
    vars.LanguageCompileFlags = "";
    vars.Defines = "";
    bVar3 = std::operator==(lang,"Swift");
    if (bVar3) {
      cldeps.field_2._M_local_buf[0xf] = ' ';
      cmStrCat<std::__cxx11::string&,char,char_const*&>
                (&local_dc8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&rule.RspFile.field_2 + 8),cldeps.field_2._M_local_buf + 0xf,
                 &vars.LinkLibraries);
      std::__cxx11::string::operator=
                ((string *)(rule.RspFile.field_2._M_local_buf + 8),(string *)&local_dc8);
      std::__cxx11::string::~string((string *)&local_dc8);
      vars.LinkLibraries = "";
    }
  }
  std::__cxx11::string::string(local_df0);
  if ((flags.field_2._M_local_buf[0xf] & 1U) != 0) {
    cmStrCat<char_const(&)[22],std::__cxx11::string_const&>
              ((string *)&d,(char (*) [22])"CMAKE_NINJA_CMCLDEPS_",lang);
    bVar3 = cmMakefile::IsOn(pcVar7,(string *)&d);
    std::__cxx11::string::~string((string *)&d);
    if (bVar3) {
      bVar3 = cmMakefile::GetIsSourceFileTryCompile(pcVar7);
      if (!bVar3) {
        std::__cxx11::string::operator=((string *)(rule.DepFile.field_2._M_local_buf + 8),"gcc");
        std::__cxx11::string::operator=
                  ((string *)(rule.Comment.field_2._M_local_buf + 8),"$DEP_FILE");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e38,"CMAKE_C_COMPILER",
                   (allocator<char> *)(cl.field_2._M_local_buf + 0xf));
        local_e18 = cmMakefile::GetDefinition(pcVar7,&local_e38);
        std::__cxx11::string::~string((string *)&local_e38);
        std::allocator<char>::~allocator((allocator<char> *)(cl.field_2._M_local_buf + 0xf));
        bVar3 = cmValue::operator_cast_to_bool(&local_e18);
        cmcldepsPath.field_2._M_local_buf[0xe] = '\0';
        cmcldepsPath.field_2._M_local_buf[0xd] = '\0';
        if (bVar3) {
          local_14e0 = cmValue::operator*[abi_cxx11_(&local_e18);
        }
        else {
          std::allocator<char>::allocator();
          cmcldepsPath.field_2._M_local_buf[0xe] = '\x01';
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e80,"CMAKE_CXX_COMPILER",
                     (allocator<char> *)(cmcldepsPath.field_2._M_local_buf + 0xf));
          cmcldepsPath.field_2._M_local_buf[0xd] = '\x01';
          local_14e0 = cmMakefile::GetSafeDefinition(pcVar7,&local_e80);
        }
        std::__cxx11::string::string((string *)local_e60,(string *)local_14e0);
        if ((cmcldepsPath.field_2._M_local_buf[0xd] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_e80);
        }
        if ((cmcldepsPath.field_2._M_local_buf[0xe] & 1U) != 0) {
          std::allocator<char>::~allocator
                    ((allocator<char> *)(cmcldepsPath.field_2._M_local_buf + 0xf));
        }
        std::__cxx11::string::string((string *)local_ea8);
        psVar8 = cmSystemTools::GetCMClDepsCommand_abi_cxx11_();
        local_eb0 = cmsys::SystemTools::GetShortPath(psVar8,(string *)local_ea8);
        local_ed2[1] = 0x20;
        local_ed2[0] = ' ';
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ef8,"CMAKE_CL_SHOWINCLUDES_PREFIX",
                   (allocator<char> *)((long)&depType + 7));
        psVar8 = cmMakefile::GetSafeDefinition(pcVar7,&local_ef8);
        cmStrCat<std::__cxx11::string&,char,std::__cxx11::string_const&,char,char_const*&,char_const(&)[18],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[3]>
                  (&local_ed0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ea8,
                   local_ed2 + 1,lang,local_ed2,&vars.LinkLibraries,
                   (char (*) [18])" $DEP_FILE $out \"",psVar8,(char (*) [4])0xfe3a30,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e60,
                   (char (*) [3])0xfe338d);
        std::__cxx11::string::operator=(local_df0,(string *)&local_ed0);
        std::__cxx11::string::~string((string *)&local_ed0);
        std::__cxx11::string::~string((string *)&local_ef8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&depType + 7));
        std::__cxx11::string::~string((string *)local_ea8);
        std::__cxx11::string::~string((string *)local_e60);
      }
    }
    else {
      pcVar10 = GetMakefile(this);
      cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16]>
                (&local_f28,(char (*) [7])0xfecd37,lang,(char (*) [16])0xfb762d);
      psVar8 = cmMakefile::GetSafeDefinition(pcVar10,&local_f28);
      std::__cxx11::string::~string((string *)&local_f28);
      local_f08 = psVar8;
      __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar8);
      __y = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("msvc",4);
      bVar3 = std::operator==(__x,__y);
      if (bVar3) {
        std::__cxx11::string::operator=((string *)(rule.DepFile.field_2._M_local_buf + 8),"msvc");
        std::__cxx11::string::clear();
      }
      else {
        std::__cxx11::string::operator=((string *)(rule.DepFile.field_2._M_local_buf + 8),"gcc");
        std::__cxx11::string::operator=
                  ((string *)(rule.Comment.field_2._M_local_buf + 8),"$DEP_FILE");
      }
      vars.Includes = (char *)std::__cxx11::string::c_str();
      vars.DependencyFile = "$out";
      cmStrCat<char_const(&)[21],std::__cxx11::string_const&>
                ((string *)((long)&depfileFlags.field_2 + 8),(char (*) [21])"CMAKE_DEPFILE_FLAGS_",
                 lang);
      psVar8 = cmMakefile::GetSafeDefinition(pcVar7,(string *)((long)&depfileFlags.field_2 + 8));
      std::__cxx11::string::string((string *)local_f98,(string *)psVar8);
      uVar15 = std::__cxx11::string::empty();
      if ((uVar15 & 1) == 0) {
        pcVar12 = std::
                  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                  ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                                *)((long)&tdi.field_2 + 8));
        pcVar9 = GetLocalGenerator(this);
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (pcVar12,(cmOutputConverter *)pcVar9,(string *)local_f98,(RuleVariables *)&mf);
        modmapFlags.field_2._M_local_buf[0xf] = ' ';
        cmStrCat<char,std::__cxx11::string&>
                  (&local_fb8,modmapFlags.field_2._M_local_buf + 0xf,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f98);
        std::__cxx11::string::operator+=((string *)local_1b0,(string *)&local_fb8);
        std::__cxx11::string::~string((string *)&local_fb8);
      }
      std::__cxx11::string::~string((string *)local_f98);
      std::__cxx11::string::~string((string *)(depfileFlags.field_2._M_local_buf + 8));
    }
  }
  if (vars.Launcher._4_4_ == Yes) {
    uVar15 = std::__cxx11::string::empty();
    if ((uVar15 & 1) == 0) {
      cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[17]>
                (&local_1000,(char (*) [7])0xfecd37,lang,(char (*) [17])"_MODULE_MAP_FLAG");
      psVar8 = cmMakefile::GetRequiredDefinition(pcVar7,&local_1000);
      std::__cxx11::string::string((string *)local_fe0,(string *)psVar8);
      std::__cxx11::string::~string((string *)&local_1000);
      cmsys::SystemTools::ReplaceString
                ((string *)local_fe0,"<MODULE_MAP_FILE>","$DYNDEP_MODULE_MAP_FILE");
      cudaCompileMode.field_2._M_local_buf[0xf] = ' ';
      cmStrCat<char,std::__cxx11::string&>
                (&local_1020,cudaCompileMode.field_2._M_local_buf + 0xf,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fe0);
      std::__cxx11::string::operator+=((string *)local_1b0,(string *)&local_1020);
      std::__cxx11::string::~string((string *)&local_1020);
      std::__cxx11::string::~string((string *)local_fe0);
    }
  }
  vars.ObjectFileDir = (char *)std::__cxx11::string::c_str();
  vars.Includes = (char *)std::__cxx11::string::c_str();
  std::__cxx11::string::string((string *)local_1048);
  bVar3 = std::operator==(lang,"CUDA");
  if (bVar3) {
    pcVar6 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1068,"CUDA_SEPARABLE_COMPILATION",
               (allocator<char> *)((long)&rdcFlag + 7));
    bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar6,&local_1068);
    std::__cxx11::string::~string((string *)&local_1068);
    std::allocator<char>::~allocator((allocator<char> *)((long)&rdcFlag + 7));
    if (bVar3) {
      pcVar10 = (this->super_cmCommonTargetGenerator).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1098,"_CMAKE_CUDA_RDC_FLAG",&local_1099);
      psVar8 = cmMakefile::GetRequiredDefinition(pcVar10,&local_1098);
      std::__cxx11::string::~string((string *)&local_1098);
      std::allocator<char>::~allocator(&local_1099);
      local_1078 = psVar8;
      cmStrCat<std::__cxx11::string&,std::__cxx11::string_const&,char_const(&)[2]>
                (&local_10c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1048,
                 psVar8,(char (*) [2])0xfb555e);
      std::__cxx11::string::operator=((string *)local_1048,(string *)&local_10c0);
      std::__cxx11::string::~string((string *)&local_10c0);
    }
    if (WriteCompileRule(std::__cxx11::string_const&,std::__cxx11::string_const&,cmNinjaTargetGenerator::WithScanning)
        ::compileModes == '\0') {
      iVar5 = __cxa_guard_acquire(&WriteCompileRule(std::__cxx11::string_const&,std::__cxx11::string_const&,cmNinjaTargetGenerator::WithScanning)
                                   ::compileModes);
      if (iVar5 != 0) {
        WriteCompileRule::compileModes._M_elems[0] =
             (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("PTX",3);
        WriteCompileRule::compileModes._M_elems[1] =
             (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("CUBIN",5);
        WriteCompileRule::compileModes._M_elems[2] =
             (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("FATBIN",6);
        WriteCompileRule::compileModes._M_elems[3] =
             (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("OPTIX",5);
        __cxa_guard_release(&WriteCompileRule(std::__cxx11::string_const&,std::__cxx11::string_const&,cmNinjaTargetGenerator::WithScanning)
                             ::compileModes);
      }
    }
    bVar3 = true;
    __end2 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_4UL>::begin
                       (&WriteCompileRule::compileModes);
    pvVar16 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_4UL>::end
                        (&WriteCompileRule::compileModes);
    for (; __end2 != pvVar16; __end2 = __end2 + 1) {
      propName.field_2._8_8_ = __end2->_M_len;
      cmStrCat<char_const(&)[6],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[13]>
                ((string *)((long)&defName.field_2 + 8),(char (*) [6])0xfb7887,
                 (basic_string_view<char,_std::char_traits<char>_> *)((long)&propName.field_2 + 8),
                 (char (*) [13])0xfb784e);
      cmStrCat<char_const(&)[13],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>
                ((string *)&flag,(char (*) [13])"_CMAKE_CUDA_",
                 (basic_string_view<char,_std::char_traits<char>_> *)((long)&propName.field_2 + 8),
                 (char (*) [6])0xfb786a);
      bVar4 = cmGeneratorTarget::GetPropertyAsBool
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget,
                         (string *)((long)&defName.field_2 + 8));
      if (bVar4) {
        local_1180 = cmMakefile::GetRequiredDefinition
                               ((this->super_cmCommonTargetGenerator).Makefile,(string *)&flag);
        cmStrCat<std::__cxx11::string&,std::__cxx11::string_const&>
                  (&local_11a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1048,
                   local_1180);
        std::__cxx11::string::operator=((string *)local_1048,(string *)&local_11a0);
        std::__cxx11::string::~string((string *)&local_11a0);
        bVar3 = false;
        wholeFlag._4_4_ = 6;
      }
      else {
        wholeFlag._4_4_ = 0;
      }
      std::__cxx11::string::~string((string *)&flag);
      std::__cxx11::string::~string((string *)(defName.field_2._M_local_buf + 8));
      if (wholeFlag._4_4_ != 0) break;
    }
    if (bVar3) {
      pcVar10 = (this->super_cmCommonTargetGenerator).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_11d0,"_CMAKE_CUDA_WHOLE_FLAG",&local_11d1);
      psVar8 = cmMakefile::GetRequiredDefinition(pcVar10,&local_11d0);
      std::__cxx11::string::~string((string *)&local_11d0);
      std::allocator<char>::~allocator(&local_11d1);
      local_11b0 = psVar8;
      cmStrCat<std::__cxx11::string&,std::__cxx11::string_const&>
                ((string *)((long)&cmdVar.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1048,
                 psVar8);
      std::__cxx11::string::operator=
                ((string *)local_1048,(string *)(cmdVar.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(cmdVar.field_2._M_local_buf + 8));
    }
    vars.ISPCHeader = (char *)std::__cxx11::string::c_str();
  }
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16]>
            ((string *)&compileCmd,(char (*) [7])0xfecd37,lang,(char (*) [16])0xfb7cf8);
  compileCmds.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       cmMakefile::GetRequiredDefinition(pcVar7,(string *)&compileCmd);
  cmList::cmList((cmList *)&extraCommands,
                 compileCmds.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,Yes,No);
  bVar3 = cmList::empty((cmList *)&extraCommands);
  if (!bVar3) {
    pvVar17 = cmList::front_abi_cxx11_((cmList *)&extraCommands);
    std::__cxx11::string::insert((ulong)pvVar17,(char *)0x0);
    pvVar17 = cmList::front_abi_cxx11_((cmList *)&extraCommands);
    std::__cxx11::string::insert((ulong)pvVar17,(char *)0x0);
  }
  bVar3 = cmList::empty((cmList *)&extraCommands);
  if (!bVar3) {
    pvVar17 = cmList::front_abi_cxx11_((cmList *)&extraCommands);
    std::__cxx11::string::insert((ulong)pvVar17,(string *)0x0);
  }
  pcVar7 = GetMakefile(this);
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[24]>
            (&local_1260,(char (*) [7])0xfecd37,lang,(char (*) [24])"_DEPENDS_EXTRA_COMMANDS");
  psVar8 = cmMakefile::GetSafeDefinition(pcVar7,&local_1260);
  std::__cxx11::string::~string((string *)&local_1260);
  local_1240 = psVar8;
  uVar15 = std::__cxx11::string::empty();
  if ((uVar15 & 1) == 0) {
    cmList::append((cmList *)&extraCommands,local_1240,Yes,No);
  }
  __end1 = cmList::begin_abi_cxx11_((cmList *)&extraCommands);
  i_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        cmList::end_abi_cxx11_((cmList *)&extraCommands);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&i_2);
    if (!bVar3) break;
    local_1288 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
    cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
              (&local_12a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&val.field_2 + 8),local_1288);
    std::__cxx11::string::operator=((string *)local_1288,(string *)&local_12a8);
    std::__cxx11::string::~string((string *)&local_12a8);
    pcVar12 = std::
              unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
              ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                            *)((long)&tdi.field_2 + 8));
    pcVar9 = GetLocalGenerator(this);
    cmRulePlaceholderExpander::ExpandRuleVariables
              (pcVar12,(cmOutputConverter *)pcVar9,local_1288,(RuleVariables *)&mf);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  pcVar9 = GetLocalGenerator(this);
  pcVar13 = cmList::operator_cast_to_vector_((cmList *)&extraCommands);
  std::__cxx11::string::string((string *)&local_12e8);
  cmLocalNinjaGenerator::BuildCommandLine
            (&local_12c8,pcVar9,pcVar13,config,config,&local_12e8,(cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=
            ((string *)(rule.Name.field_2._M_local_buf + 8),(string *)&local_12c8);
  std::__cxx11::string::~string((string *)&local_12c8);
  std::__cxx11::string::~string((string *)&local_12e8);
  cmStrCat<char_const(&)[20],std::__cxx11::string_const&,char_const(&)[8]>
            (&local_1308,(char (*) [20])"Rule for compiling ",lang,(char (*) [8])0xfe9b3c);
  std::__cxx11::string::operator=
            ((string *)(rule.Description.field_2._M_local_buf + 8),(string *)&local_1308);
  std::__cxx11::string::~string((string *)&local_1308);
  cmStrCat<char_const(&)[10],std::__cxx11::string_const&,char_const(&)[13]>
            (&local_1328,(char (*) [10])"Building ",lang,(char (*) [13])" object $out");
  std::__cxx11::string::operator=
            ((string *)(rule.Command.field_2._M_local_buf + 8),(string *)&local_1328);
  std::__cxx11::string::~string((string *)&local_1328);
  pcVar14 = GetGlobalGenerator(this);
  cmGlobalNinjaGenerator::AddRule(pcVar14,(cmNinjaRule *)local_d40);
  cmList::~cmList((cmList *)&extraCommands);
  std::__cxx11::string::~string((string *)&compileCmd);
  std::__cxx11::string::~string((string *)local_1048);
  std::__cxx11::string::~string(local_df0);
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_d40);
  std::__cxx11::string::~string((string *)local_368);
  std::__cxx11::string::~string((string *)local_2e8);
  std::__cxx11::string::~string((string *)(val.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_278);
  std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
  ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
               *)((long)&tdi.field_2 + 8));
  std::__cxx11::string::~string((string *)&rulePlaceholderExpander);
  std::__cxx11::string::~string((string *)(modmapFormat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string((string *)local_1b0);
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteCompileRule(const std::string& lang,
                                              const std::string& config,
                                              WithScanning withScanning)
{
  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType()).c_str();
  vars.Language = lang.c_str();
  vars.Source = "$in";
  vars.Object = "$out";
  vars.Defines = "$DEFINES";
  vars.Includes = "$INCLUDES";
  vars.TargetPDB = "$TARGET_PDB";
  vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";
  vars.ObjectDir = "$OBJECT_DIR";
  vars.ObjectFileDir = "$OBJECT_FILE_DIR";
  vars.CudaCompileMode = "$CUDA_COMPILE_MODE";
  vars.ISPCHeader = "$ISPC_HEADER_FILE";

  cmMakefile* mf = this->GetMakefile();

  // For some cases we scan to dynamically discover dependencies.
  bool const compilationPreprocesses = !this->NeedExplicitPreprocessing(lang);

  std::string flags = "$FLAGS";

  std::string responseFlag;
  bool const lang_supports_response = lang != "RC";
  if (lang_supports_response && this->ForceResponseFile()) {
    std::string const responseFlagVar =
      cmStrCat("CMAKE_", lang, "_RESPONSE_FILE_FLAG");
    responseFlag = this->Makefile->GetSafeDefinition(responseFlagVar);
    if (responseFlag.empty() && lang != "CUDA") {
      responseFlag = "@";
    }
  }
  std::string const modmapFormatVar =
    cmStrCat("CMAKE_", lang, "_MODULE_MAP_FORMAT");
  std::string const modmapFormat =
    this->Makefile->GetSafeDefinition(modmapFormatVar);

  auto rulePlaceholderExpander =
    this->GetLocalGenerator()->CreateRulePlaceholderExpander();

  std::string const tdi = this->GetLocalGenerator()->ConvertToOutputFormat(
    this->ConvertToNinjaPath(this->GetTargetDependInfoPath(lang, config)),
    cmLocalGenerator::SHELL);

  std::string launcher;
  std::string val = this->GetLocalGenerator()->GetRuleLauncher(
    this->GetGeneratorTarget(), "RULE_LAUNCH_COMPILE", config);
  if (cmNonempty(val)) {
    launcher = cmStrCat(val, ' ');
  }

  std::string const cmakeCmd =
    this->GetLocalGenerator()->ConvertToOutputFormat(
      cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL);

  if (withScanning == WithScanning::Yes) {
    const auto& scanDepType = this->GetMakefile()->GetSafeDefinition(
      cmStrCat("CMAKE_", lang, "_SCANDEP_DEPFILE_FORMAT"));

    // Rule to scan dependencies of sources that need preprocessing.
    {
      cmList scanCommands;
      std::string scanRuleName;
      std::string ppFileName;
      if (compilationPreprocesses) {
        scanRuleName = this->LanguageScanRule(lang, config);
        ppFileName = "$PREPROCESSED_OUTPUT_FILE";
        std::string const& scanCommand = mf->GetRequiredDefinition(
          cmStrCat("CMAKE_", lang, "_SCANDEP_SOURCE"));
        scanCommands.assign(scanCommand);
        for (auto& i : scanCommands) {
          i = cmStrCat(launcher, i);
        }
      } else {
        scanRuleName = this->LanguagePreprocessAndScanRule(lang, config);
        ppFileName = "$out";
        std::string const& ppCommmand = mf->GetRequiredDefinition(
          cmStrCat("CMAKE_", lang, "_PREPROCESS_SOURCE"));
        scanCommands.assign(ppCommmand);
        for (auto& i : scanCommands) {
          i = cmStrCat(launcher, i);
        }
        scanCommands.emplace_back(GetScanCommand(
          cmakeCmd, tdi, lang, "$out", "$DYNDEP_INTERMEDIATE_FILE", "$in"));
      }

      auto scanRule = GetScanRule(
        scanRuleName, ppFileName, scanDepType, vars, responseFlag, flags,
        rulePlaceholderExpander.get(), this->GetLocalGenerator(),
        std::move(scanCommands), config);

      scanRule.Comment =
        cmStrCat("Rule for generating ", lang, " dependencies.");
      if (compilationPreprocesses) {
        scanRule.Description =
          cmStrCat("Scanning $in for ", lang, " dependencies");
      } else {
        scanRule.Description =
          cmStrCat("Building ", lang, " preprocessed $out");
      }

      this->GetGlobalGenerator()->AddRule(scanRule);
    }

    if (!compilationPreprocesses) {
      // Compilation will not preprocess, so it does not need the defines
      // unless the compiler wants them for some other purpose.
      if (!this->CompileWithDefines(lang)) {
        vars.Defines = "";
      }

      // Rule to scan dependencies of sources that do not need preprocessing.
      std::string const& scanRuleName = this->LanguageScanRule(lang, config);
      std::vector<std::string> scanCommands;
      scanCommands.emplace_back(
        GetScanCommand(cmakeCmd, tdi, lang, "$in", "$out"));

      auto scanRule =
        GetScanRule(scanRuleName, "", scanDepType, vars, "", flags,
                    rulePlaceholderExpander.get(), this->GetLocalGenerator(),
                    std::move(scanCommands), config);

      // Write the rule for generating dependencies for the given language.
      scanRule.Comment = cmStrCat("Rule for generating ", lang,
                                  " dependencies on non-preprocessed files.");
      scanRule.Description =
        cmStrCat("Generating ", lang, " dependencies for $in");

      this->GetGlobalGenerator()->AddRule(scanRule);
    }

    // Write the rule for ninja dyndep file generation.
    cmNinjaRule rule(this->LanguageDyndepRule(lang, config));
    // Command line length is almost always limited -> use response file for
    // dyndep rules
    rule.RspFile = "$out.rsp";
    rule.RspContent = "$in";
    // Ninja's collator writes all outputs using `cmGeneratedFileStream`, so
    // they are only updated if contents actually change. Avoid running
    // dependent jobs if the contents don't change by telling `ninja` to check
    // the timestamp again.
    rule.Restat = "1";

    // Run CMake dependency scanner on the source file (using the preprocessed
    // source if that was performed).
    std::string ddModmapArg;
    if (!modmapFormat.empty()) {
      ddModmapArg += cmStrCat(" --modmapfmt=", modmapFormat);
    }
    {
      std::vector<std::string> ddCmds;
      {
        std::string ccmd = cmStrCat(
          cmakeCmd, " -E cmake_ninja_dyndep --tdi=", tdi, " --lang=", lang,
          ddModmapArg, " --dd=$out @", rule.RspFile);
        ddCmds.emplace_back(std::move(ccmd));
      }
      rule.Command =
        this->GetLocalGenerator()->BuildCommandLine(ddCmds, config, config);
    }
    rule.Comment =
      cmStrCat("Rule to generate ninja dyndep files for ", lang, '.');
    rule.Description = cmStrCat("Generating ", lang, " dyndep file $out");
    this->GetGlobalGenerator()->AddRule(rule);
  }

  cmNinjaRule rule(this->LanguageCompilerRule(lang, config, withScanning));
  // If using a response file, move defines, includes, and flags into it.
  if (!responseFlag.empty()) {
    rule.RspFile = "$RSP_FILE";
    rule.RspContent =
      cmStrCat(' ', vars.Defines, ' ', vars.Includes, ' ', flags);
    flags = cmStrCat(responseFlag, rule.RspFile);
    vars.Defines = "";
    vars.Includes = "";

    // Swift consumes all source files in a module at once, which reaches
    // command line length limits pretty quickly. Inject source files into the
    // response file in this case as well.
    if (lang == "Swift") {
      rule.RspContent = cmStrCat(rule.RspContent, ' ', vars.Source);
      vars.Source = "";
    }
  }

  // Tell ninja dependency format so all deps can be loaded into a database
  std::string cldeps;
  if (!compilationPreprocesses) {
    // The compiler will not do preprocessing, so it has no such dependencies.
  } else if (mf->IsOn(cmStrCat("CMAKE_NINJA_CMCLDEPS_", lang))) {
    // For the MS resource compiler we need cmcldeps, but skip dependencies
    // for source-file try_compile cases because they are always fresh.
    if (!mf->GetIsSourceFileTryCompile()) {
      rule.DepType = "gcc";
      rule.DepFile = "$DEP_FILE";
      cmValue d = mf->GetDefinition("CMAKE_C_COMPILER");
      const std::string cl =
        d ? *d : mf->GetSafeDefinition("CMAKE_CXX_COMPILER");
      std::string cmcldepsPath;
      cmSystemTools::GetShortPath(cmSystemTools::GetCMClDepsCommand(),
                                  cmcldepsPath);
      cldeps = cmStrCat(cmcldepsPath, ' ', lang, ' ', vars.Source,
                        " $DEP_FILE $out \"",
                        mf->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX"),
                        "\" \"", cl, "\" ");
    }
  } else {
    const auto& depType = this->GetMakefile()->GetSafeDefinition(
      cmStrCat("CMAKE_", lang, "_DEPFILE_FORMAT"));
    if (depType == "msvc"_s) {
      rule.DepType = "msvc";
      rule.DepFile.clear();
    } else {
      rule.DepType = "gcc";
      rule.DepFile = "$DEP_FILE";
    }
    vars.DependencyFile = rule.DepFile.c_str();
    vars.DependencyTarget = "$out";

    const std::string flagsName = cmStrCat("CMAKE_DEPFILE_FLAGS_", lang);
    std::string depfileFlags = mf->GetSafeDefinition(flagsName);
    if (!depfileFlags.empty()) {
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   depfileFlags, vars);
      flags += cmStrCat(' ', depfileFlags);
    }
  }

  if (withScanning == WithScanning::Yes && !modmapFormat.empty()) {
    std::string modmapFlags =
      mf->GetRequiredDefinition(cmStrCat("CMAKE_", lang, "_MODULE_MAP_FLAG"));
    cmSystemTools::ReplaceString(modmapFlags, "<MODULE_MAP_FILE>",
                                 "$DYNDEP_MODULE_MAP_FILE");
    flags += cmStrCat(' ', modmapFlags);
  }

  vars.Flags = flags.c_str();
  vars.DependencyFile = rule.DepFile.c_str();

  std::string cudaCompileMode;
  if (lang == "CUDA") {
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      const std::string& rdcFlag =
        this->Makefile->GetRequiredDefinition("_CMAKE_CUDA_RDC_FLAG");
      cudaCompileMode = cmStrCat(cudaCompileMode, rdcFlag, " ");
    }
    static std::array<cm::string_view, 4> const compileModes{
      { "PTX"_s, "CUBIN"_s, "FATBIN"_s, "OPTIX"_s }
    };
    bool useNormalCompileMode = true;
    for (cm::string_view mode : compileModes) {
      auto propName = cmStrCat("CUDA_", mode, "_COMPILATION");
      auto defName = cmStrCat("_CMAKE_CUDA_", mode, "_FLAG");
      if (this->GeneratorTarget->GetPropertyAsBool(propName)) {
        const std::string& flag =
          this->Makefile->GetRequiredDefinition(defName);
        cudaCompileMode = cmStrCat(cudaCompileMode, flag);
        useNormalCompileMode = false;
        break;
      }
    }
    if (useNormalCompileMode) {
      const std::string& wholeFlag =
        this->Makefile->GetRequiredDefinition("_CMAKE_CUDA_WHOLE_FLAG");
      cudaCompileMode = cmStrCat(cudaCompileMode, wholeFlag);
    }
    vars.CudaCompileMode = cudaCompileMode.c_str();
  }

  // Rule for compiling object file.
  const std::string cmdVar = cmStrCat("CMAKE_", lang, "_COMPILE_OBJECT");
  const std::string& compileCmd = mf->GetRequiredDefinition(cmdVar);
  cmList compileCmds(compileCmd);

  if (!compileCmds.empty()) {
    compileCmds.front().insert(0, "${CODE_CHECK}");
    compileCmds.front().insert(0, "${LAUNCHER}");
  }

  if (!compileCmds.empty()) {
    compileCmds.front().insert(0, cldeps);
  }

  const auto& extraCommands = this->GetMakefile()->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_DEPENDS_EXTRA_COMMANDS"));
  if (!extraCommands.empty()) {
    compileCmds.append(extraCommands);
  }

  for (auto& i : compileCmds) {
    i = cmStrCat(launcher, i);
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), i,
                                                 vars);
  }

  rule.Command =
    this->GetLocalGenerator()->BuildCommandLine(compileCmds, config, config);

  // Write the rule for compiling file of the given language.
  rule.Comment = cmStrCat("Rule for compiling ", lang, " files.");
  rule.Description = cmStrCat("Building ", lang, " object $out");
  this->GetGlobalGenerator()->AddRule(rule);
}